

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionHandler.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGL3ExtensionHandler::initExtensionsOld(COpenGL3ExtensionHandler *this)

{
  GLubyte *__s;
  char *pcVar1;
  allocator<char> local_51;
  long *local_50 [2];
  long local_40 [2];
  
  __s = (*GL.GetString)(0x1f03);
  do {
    pcVar1 = strchr((char *)__s,0x20);
    if (pcVar1 != (char *)0x0) {
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s,pcVar1);
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_M_emplace<std::__cxx11::string>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&this->Extensions,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      __s = (GLubyte *)(pcVar1 + 1);
    }
  } while (pcVar1 != (char *)0x0);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)local_50,(char *)__s,&local_51);
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_M_emplace<std::__cxx11::string>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->Extensions,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  extensionsLoaded(this);
  return;
}

Assistant:

void COpenGL3ExtensionHandler::initExtensionsOld()
{
	auto extensions_string = reinterpret_cast<const char *>(GL.GetString(GL_EXTENSIONS));
	const char *pos = extensions_string;
	while (const char *next = strchr(pos, ' ')) {
		addExtension(std::string{pos, next});
		pos = next + 1;
	}
	addExtension(pos);
	extensionsLoaded();
}